

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O0

bool tinyusdz::is_close(matrix2d *a,matrix2d *b,double eps)

{
  bool bVar1;
  bool local_21;
  double eps_local;
  matrix2d *b_local;
  matrix2d *a_local;
  
  bVar1 = math::is_close(a->m[0][0],b->m[0][0],eps);
  local_21 = false;
  if (bVar1) {
    bVar1 = math::is_close(a->m[0][1],b->m[0][1],eps);
    local_21 = false;
    if (bVar1) {
      bVar1 = math::is_close(a->m[1][0],b->m[1][0],eps);
      local_21 = false;
      if (bVar1) {
        local_21 = math::is_close(a->m[1][1],b->m[1][1],eps);
      }
    }
  }
  return local_21;
}

Assistant:

bool is_close(const value::matrix2d &a, const value::matrix2d &b, const double eps) {
  return math::is_close(a.m[0][0], b.m[0][0], eps) &&
         math::is_close(a.m[0][1], b.m[0][1], eps) &&
         math::is_close(a.m[1][0], b.m[1][0], eps) &&
         math::is_close(a.m[1][1], b.m[1][1], eps);
}